

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSMTree.cpp
# Opt level: O2

void __thiscall LSMTree::reset(LSMTree *this)

{
  MemTable *pMVar1;
  DiskTable *pDVar2;
  
  pMVar1 = this->memory;
  if (pMVar1 != (MemTable *)0x0) {
    MemTable::~MemTable(pMVar1);
  }
  operator_delete(pMVar1,0x30);
  pDVar2 = this->disk;
  if (pDVar2 != (DiskTable *)0x0) {
    DiskTable::~DiskTable(pDVar2);
  }
  operator_delete(pDVar2,0x58);
  std::filesystem::remove_all(&this->data_home);
  pMVar1 = (MemTable *)operator_new(0x30);
  MemTable::MemTable(pMVar1);
  this->memory = pMVar1;
  pDVar2 = (DiskTable *)operator_new(0x58);
  DiskTable::DiskTable(pDVar2,&this->data_home);
  this->disk = pDVar2;
  return;
}

Assistant:

void LSMTree::reset() {
    delete memory;
    delete disk;
    remove_all(data_home);
    memory = new MemTable{};
    disk = new DiskTable{data_home};
}